

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_TextureMapping::GetTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_SimpleArray<ON_2fPoint> *T,ON_Xform *mesh_xform,
          bool bLazy,ON_SimpleArray<int> *Tside)

{
  int iVar1;
  uint uVar2;
  ON_TextureCoordinates *pOVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  ON_SimpleArray<ON_3fPoint> T3;
  ON_SimpleArray<ON_3fPoint> local_48;
  
  if ((Tside != (ON_SimpleArray<int> *)0x0) && (-1 < Tside->m_capacity)) {
    Tside->m_count = 0;
  }
  if (bLazy) {
    bVar4 = ON_Mesh::HasTextureCoordinates(mesh);
    if ((bVar4) && (bVar4 = HasMatchingTextureCoordinates(this,&mesh->m_Ttag,mesh_xform), bVar4)) {
      if (T->m_a == (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a) {
        return true;
      }
      ON_SimpleArray<ON_2fPoint>::operator=(T,&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
      return true;
    }
    lVar5 = (long)(mesh->m_TC).m_count;
    if (0 < lVar5) {
      iVar1 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      lVar6 = 0;
      do {
        pOVar3 = (mesh->m_TC).m_a;
        if ((iVar1 == *(int *)((long)&(pOVar3->m_T).m_count + lVar6)) &&
           (bVar4 = HasMatchingTextureCoordinates
                              (this,(ON_MappingTag *)
                                    ((pOVar3->m_tag).m_mapping_id.Data4 + lVar6 + -8),mesh_xform),
           bVar4)) {
          ThreeToTwoHelper((ON_SimpleArray<ON_3fPoint> *)
                           ((long)&(((mesh->m_TC).m_a)->m_T)._vptr_ON_SimpleArray + lVar6),T);
          return true;
        }
        lVar6 = lVar6 + 0xb8;
      } while (lVar5 * 0xb8 - lVar6 != 0);
    }
  }
  if (this->m_type == srfp_mapping) {
    bVar4 = ON_Mesh::HasSurfaceParameters(mesh);
    if (bVar4) {
      uVar2 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      if ((uint)T->m_capacity < uVar2) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity(T,(long)(int)uVar2);
      }
      iVar1 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      uVar2 = T->m_capacity;
      if (iVar1 <= (int)uVar2 && -1 < iVar1) {
        T->m_count = iVar1;
      }
      if (0 < (int)uVar2 && T->m_a != (ON_2fPoint *)0x0) {
        memset(T->m_a,0,(ulong)uVar2 << 3);
      }
      bVar4 = GetSPTCHelper(mesh,this,&T->m_a->x,2);
      return bVar4;
    }
    bVar4 = false;
  }
  else {
    if (-1 < T->m_capacity) {
      T->m_count = 0;
    }
    local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081a820;
    local_48.m_a = (ON_3fPoint *)0x0;
    local_48.m_count = 0;
    local_48.m_capacity = 0;
    bVar4 = GetTextureCoordinates(this,mesh,&local_48,mesh_xform,false,Tside);
    if (bVar4) {
      ThreeToTwoHelper(&local_48,T);
    }
    ON_SimpleArray<ON_3fPoint>::~ON_SimpleArray(&local_48);
  }
  return bVar4;
}

Assistant:

bool ON_TextureMapping::GetTextureCoordinates(
            const ON_Mesh& mesh,
            ON_SimpleArray<ON_2fPoint>& T,
            const ON_Xform* mesh_xform,
            bool bLazy,
            ON_SimpleArray<int>* Tside
            ) const
{
  bool rc = false;
  if ( Tside )
    Tside->SetCount(0);
  if ( bLazy )
  {
    if ( HasMatchingTextureCoordinates(mesh,mesh_xform ) )
    {
      if ( T.Array() != mesh.m_T.Array() )
      {
        // different arrays - copy
        T = mesh.m_T;
      }
      return true;
    }
    else
    {
      int vcnt = mesh.m_V.Count();
      int tci, tccount = mesh.m_TC.Count();
      for ( tci = 0; tci < tccount; tci++ )
      {
        if ( vcnt == mesh.m_TC[tci].m_T.Count() )
        {
          if ( HasMatchingTextureCoordinates(mesh.m_TC[tci].m_tag,mesh_xform) )
          {
            // copy T3d[] results to T[]
            ThreeToTwoHelper(mesh.m_TC[tci].m_T,T);
            return true;
          }
        }
      }
    }
  }

  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
  {
    if (mesh.HasSurfaceParameters())
    {
      // uv textures from surface parameterization
      T.Reserve(mesh.m_V.Count());
      T.SetCount(mesh.m_V.Count());
      T.Zero();
      rc = GetSPTCHelper(mesh, *this, &T[0].x, 2);
    }
    else
    {
      //In this case, we're just going to leave the TC array in place
      rc = false;
    }
  }
  else
  {
    T.SetCount(0);
	  ON_SimpleArray<ON_3fPoint> T3;
    if ( GetTextureCoordinates(mesh, T3, mesh_xform, false, Tside ) )
    {
      // copy T3d[] results to T[]
      ThreeToTwoHelper(T3,T);
      rc = true;
	  }
  }
	return rc;
}